

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output
               (xml_buffered_writer *writer,xml_node_struct *root,char_t *indent,uint flags,
               uint depth)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  size_t __n;
  char_t *extraout_RDX;
  char_t *extraout_RDX_00;
  char_t *extraout_RDX_01;
  char_t *extraout_RDX_02;
  char_t *extraout_RDX_03;
  char_t *extraout_RDX_04;
  char_t *__buf;
  char_t *extraout_RDX_05;
  bool bVar2;
  size_t local_48;
  xml_node_struct *local_40;
  xml_node_struct *node;
  uint indent_flags;
  size_t indent_length;
  uint depth_local;
  uint flags_local;
  char_t *indent_local;
  xml_node_struct *root_local;
  xml_buffered_writer *writer_local;
  
  __n = CONCAT44(in_register_0000000c,flags);
  if (((flags & 0x41) == 0) || ((flags & 4) != 0)) {
    local_48 = 0;
    __buf = indent;
  }
  else {
    local_48 = strlength(indent);
    __buf = extraout_RDX;
  }
  bVar1 = true;
  bVar2 = false;
  local_40 = root;
  indent_length._0_4_ = depth;
  do {
    if (local_40 == (xml_node_struct *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x1095,
                    "void pugi::impl::(anonymous namespace)::node_output(xml_buffered_writer &, xml_node_struct *, const char_t *, unsigned int, unsigned int)"
                   );
    }
    if ((((uint)local_40->header & 0xf) == 3) || (((uint)local_40->header & 0xf) == 4)) {
      node_output_simple(writer,local_40,flags);
      bVar1 = false;
      bVar2 = false;
      __buf = extraout_RDX_00;
LAB_00109227:
      while (local_40 != root) {
        if (local_40->next_sibling != (xml_node_struct *)0x0) {
          local_40 = local_40->next_sibling;
          break;
        }
        local_40 = local_40->parent;
        if (((uint)local_40->header & 0xf) == 2) {
          indent_length._0_4_ = (uint)indent_length - 1;
          if ((bVar2) && ((flags & 4) == 0)) {
            xml_buffered_writer::write(writer,10,__buf,__n);
          }
          if ((bVar1) && (local_48 != 0)) {
            __n = (size_t)(uint)indent_length;
            text_output_indent(writer,indent,local_48,(uint)indent_length);
          }
          node_output_end(writer,local_40);
          bVar1 = true;
          bVar2 = true;
          __buf = extraout_RDX_05;
        }
      }
    }
    else {
      if ((bVar2) && ((flags & 4) == 0)) {
        xml_buffered_writer::write(writer,10,__buf,__n);
        __buf = extraout_RDX_01;
      }
      if ((bVar1) && (local_48 != 0)) {
        __n = (size_t)(uint)indent_length;
        text_output_indent(writer,indent,local_48,(uint)indent_length);
        __buf = extraout_RDX_02;
      }
      if (((uint)local_40->header & 0xf) != 2) {
        if (((uint)local_40->header & 0xf) == 1) {
          bVar1 = true;
          bVar2 = false;
          if (local_40->first_child != (xml_node_struct *)0x0) {
            local_40 = local_40->first_child;
            goto LAB_001092db;
          }
        }
        else {
          node_output_simple(writer,local_40,flags);
          bVar2 = true;
          __buf = extraout_RDX_04;
        }
LAB_00109223:
        bVar1 = true;
        goto LAB_00109227;
      }
      bVar2 = true;
      __n = local_48;
      bVar1 = node_output_start(writer,local_40,indent,local_48,flags,(uint)indent_length);
      __buf = extraout_RDX_03;
      if (!bVar1) goto LAB_00109223;
      bVar2 = local_40->value == (char_t *)0x0;
      local_40 = local_40->first_child;
      indent_length._0_4_ = (uint)indent_length + 1;
      bVar1 = bVar2;
    }
LAB_001092db:
    if (local_40 == root) {
      if ((bVar2) && ((flags & 4) == 0)) {
        xml_buffered_writer::write(writer,10,__buf,__n);
      }
      return;
    }
  } while( true );
}

Assistant:

PUGI__FN void node_output(xml_buffered_writer& writer, xml_node_struct* root, const char_t* indent, unsigned int flags, unsigned int depth)
	{
		size_t indent_length = ((flags & (format_indent | format_indent_attributes)) && (flags & format_raw) == 0) ? strlength(indent) : 0;
		unsigned int indent_flags = indent_indent;

		xml_node_struct* node = root;

		do
		{
			assert(node);

			// begin writing current node
			if (PUGI__NODETYPE(node) == node_pcdata || PUGI__NODETYPE(node) == node_cdata)
			{
				node_output_simple(writer, node, flags);

				indent_flags = 0;
			}
			else
			{
				if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
					writer.write('\n');

				if ((indent_flags & indent_indent) && indent_length)
					text_output_indent(writer, indent, indent_length, depth);

				if (PUGI__NODETYPE(node) == node_element)
				{
					indent_flags = indent_newline | indent_indent;

					if (node_output_start(writer, node, indent, indent_length, flags, depth))
					{
						// element nodes can have value if parse_embed_pcdata was used
						if (node->value)
							indent_flags = 0;

						node = node->first_child;
						depth++;
						continue;
					}
				}
				else if (PUGI__NODETYPE(node) == node_document)
				{
					indent_flags = indent_indent;

					if (node->first_child)
					{
						node = node->first_child;
						continue;
					}
				}
				else
				{
					node_output_simple(writer, node, flags);

					indent_flags = indent_newline | indent_indent;
				}
			}

			// continue to the next node
			while (node != root)
			{
				if (node->next_sibling)
				{
					node = node->next_sibling;
					break;
				}

				node = node->parent;

				// write closing node
				if (PUGI__NODETYPE(node) == node_element)
				{
					depth--;

					if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
						writer.write('\n');

					if ((indent_flags & indent_indent) && indent_length)
						text_output_indent(writer, indent, indent_length, depth);

					node_output_end(writer, node);

					indent_flags = indent_newline | indent_indent;
				}
			}
		}
		while (node != root);

		if ((indent_flags & indent_newline) && (flags & format_raw) == 0)
			writer.write('\n');
	}